

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalUnmapViewOfFile(CPalThread *pThread,LPCVOID lpBaseAddress)

{
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  FILE *__stream;
  int iVar3;
  PMAPPED_VIEW_LIST pvMem;
  int *piVar4;
  char *pcVar5;
  IPalObject *pIVar6;
  PAL_ERROR PVar7;
  
  InternalEnterCriticalSection(pThread,&mapping_critsec);
  pvMem = MAPGetViewForAddress(lpBaseAddress);
  if (pvMem == (PMAPPED_VIEW_LIST)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) {
      abort();
    }
    PVar7 = 6;
    pIVar6 = (IPalObject *)0x0;
  }
  else {
    iVar3 = munmap(lpBaseAddress,pvMem->NumberOfBytesToMap);
    PVar7 = 0;
    if (iVar3 == -1) {
      fprintf(_stderr,"] %s %s:%d","InternalUnmapViewOfFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x5c1);
      __stream = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(__stream,"Unable to unmap the memory. Error=%s.\n",pcVar5);
      PVar7 = 0x54f;
    }
    p_Var1 = (pvMem->Link).Flink;
    p_Var2 = (pvMem->Link).Blink;
    p_Var2->Flink = p_Var1;
    p_Var1->Blink = p_Var2;
    pIVar6 = pvMem->pFileMapping;
    InternalFree(pvMem);
  }
  InternalLeaveCriticalSection(pThread,&mapping_critsec);
  if (pIVar6 != (IPalObject *)0x0) {
    (*pIVar6->_vptr_IPalObject[8])(pIVar6,pThread);
  }
  return PVar7;
}

Assistant:

PAL_ERROR
CorUnix::InternalUnmapViewOfFile(
    CPalThread *pThread,
    LPCVOID lpBaseAddress
    )
{
    PAL_ERROR palError = NO_ERROR;
    PMAPPED_VIEW_LIST pView = NULL;
    IPalObject *pMappingObject = NULL;

    InternalEnterCriticalSection(pThread, &mapping_critsec);

    pView = MAPGetViewForAddress(lpBaseAddress);
    if (NULL == pView)
    {
        ERROR("lpBaseAddress has to be the address returned by MapViewOfFile[Ex]");
        palError = ERROR_INVALID_HANDLE;
        goto InternalUnmapViewOfFileExit;
    }
    
#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    NativeMapHolderRelease(pThread, pView->pNMHolder);
    pView->pNMHolder = NULL;
#else
    if (-1 == munmap((LPVOID)lpBaseAddress, pView->NumberOfBytesToMap))
    {
        ASSERT( "Unable to unmap the memory. Error=%s.\n",
                strerror( errno ) );
        palError = ERROR_INTERNAL_ERROR;

        //
        // Even if the unmap fails we want to continue removing the
        // info for this view
        //
    }
#endif

    RemoveEntryList(&pView->Link);
    pMappingObject = pView->pFileMapping;
    InternalFree(pView);
    
InternalUnmapViewOfFileExit:

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

    //
    // We can't dereference the file mapping object until after
    // we've released the mapping critical section, since it may
    // start going down its cleanup path and we don't want to make
    // any assumptions as to what locks that might grab...
    //

    if (NULL != pMappingObject)
    {
        pMappingObject->ReleaseReference(pThread);
    }

    return palError;
}